

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::StencilTexturingTests::init(StencilTexturingTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  UploadTex2DCase *pUVar3;
  UploadTex2DArrayCase *pUVar4;
  UploadTexCubeCase *pUVar5;
  ClearTex2DCase *pCVar6;
  RenderTex2DCase *pRVar7;
  TestCase *pTVar8;
  char *pcVar9;
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"format",
             "Formats");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pUVar3 = (UploadTex2DCase *)operator_new(0x80);
  anon_unknown_1::UploadTex2DCase::UploadTex2DCase
            (pUVar3,(this->super_TestCaseGroup).m_context,"depth32f_stencil8_2d",0x8cad);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pUVar3);
  pUVar4 = (UploadTex2DArrayCase *)operator_new(0x80);
  anon_unknown_1::UploadTex2DArrayCase::UploadTex2DArrayCase
            (pUVar4,(this->super_TestCaseGroup).m_context,"depth32f_stencil8_2d_array",0x8cad);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pUVar4);
  pUVar5 = (UploadTexCubeCase *)operator_new(0x80);
  anon_unknown_1::UploadTexCubeCase::UploadTexCubeCase
            (pUVar5,(this->super_TestCaseGroup).m_context,"depth32f_stencil8_cube",0x8cad);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pUVar5);
  pUVar3 = (UploadTex2DCase *)operator_new(0x80);
  anon_unknown_1::UploadTex2DCase::UploadTex2DCase
            (pUVar3,(this->super_TestCaseGroup).m_context,"depth24_stencil8_2d",0x88f0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pUVar3);
  pUVar4 = (UploadTex2DArrayCase *)operator_new(0x80);
  anon_unknown_1::UploadTex2DArrayCase::UploadTex2DArrayCase
            (pUVar4,(this->super_TestCaseGroup).m_context,"depth24_stencil8_2d_array",0x88f0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pUVar4);
  pUVar5 = (UploadTexCubeCase *)operator_new(0x80);
  anon_unknown_1::UploadTexCubeCase::UploadTexCubeCase
            (pUVar5,(this->super_TestCaseGroup).m_context,"depth24_stencil8_cube",0x88f0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pUVar5);
  pUVar3 = (UploadTex2DCase *)operator_new(0x80);
  anon_unknown_1::UploadTex2DCase::UploadTex2DCase
            (pUVar3,(this->super_TestCaseGroup).m_context,"stencil_index8_2d",0x8d48);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pUVar3);
  pUVar4 = (UploadTex2DArrayCase *)operator_new(0x80);
  anon_unknown_1::UploadTex2DArrayCase::UploadTex2DArrayCase
            (pUVar4,(this->super_TestCaseGroup).m_context,"stencil_index8_2d_array",0x8d48);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pUVar4);
  pUVar5 = (UploadTexCubeCase *)operator_new(0x80);
  anon_unknown_1::UploadTexCubeCase::UploadTexCubeCase
            (pUVar5,(this->super_TestCaseGroup).m_context,"stencil_index8_cube",0x8d48);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pUVar5);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"render",
             "Read rendered stencil values");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pCVar6 = (ClearTex2DCase *)operator_new(0x80);
  anon_unknown_1::ClearTex2DCase::ClearTex2DCase
            (pCVar6,(this->super_TestCaseGroup).m_context,"depth32f_stencil8_clear",0x8cad);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pCVar6);
  pRVar7 = (RenderTex2DCase *)operator_new(0x80);
  anon_unknown_1::RenderTex2DCase::RenderTex2DCase
            (pRVar7,(this->super_TestCaseGroup).m_context,"depth32f_stencil8_draw",0x8cad);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar7);
  pCVar6 = (ClearTex2DCase *)operator_new(0x80);
  anon_unknown_1::ClearTex2DCase::ClearTex2DCase
            (pCVar6,(this->super_TestCaseGroup).m_context,"depth24_stencil8_clear",0x88f0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pCVar6);
  pRVar7 = (RenderTex2DCase *)operator_new(0x80);
  anon_unknown_1::RenderTex2DCase::RenderTex2DCase
            (pRVar7,(this->super_TestCaseGroup).m_context,"depth24_stencil8_draw",0x88f0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar7);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"misc",
             "Misc cases");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar8 = (TestCase *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  pcVar9 = glu::getTextureFormatName(0x88f0);
  gles31::TestCase::TestCase(pTVar8,pCVar1,"compare_mode_effect",pcVar9);
  (pTVar8->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e4d1d0;
  *(undefined4 *)&pTVar8[1].super_TestCase.super_TestNode._vptr_TestNode = 0x88f0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pTVar8);
  pTVar8 = (TestCase *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  pcVar9 = glu::getTextureFormatName(0x88f0);
  gles31::TestCase::TestCase(pTVar8,pCVar1,"base_level",pcVar9);
  (pTVar8->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e4d220;
  *(undefined4 *)&pTVar8[1].super_TestCase.super_TestNode._vptr_TestNode = 0x88f0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pTVar8);
  return extraout_EAX;
}

Assistant:

void StencilTexturingTests::init (void)
{
	// .format
	{
		tcu::TestCaseGroup* const formatGroup = new tcu::TestCaseGroup(m_testCtx, "format", "Formats");
		addChild(formatGroup);

		formatGroup->addChild(new UploadTex2DCase		(m_context, "depth32f_stencil8_2d",			GL_DEPTH32F_STENCIL8));
		formatGroup->addChild(new UploadTex2DArrayCase	(m_context, "depth32f_stencil8_2d_array",	GL_DEPTH32F_STENCIL8));
		formatGroup->addChild(new UploadTexCubeCase		(m_context, "depth32f_stencil8_cube",		GL_DEPTH32F_STENCIL8));
		formatGroup->addChild(new UploadTex2DCase		(m_context, "depth24_stencil8_2d",			GL_DEPTH24_STENCIL8));
		formatGroup->addChild(new UploadTex2DArrayCase	(m_context, "depth24_stencil8_2d_array",	GL_DEPTH24_STENCIL8));
		formatGroup->addChild(new UploadTexCubeCase		(m_context, "depth24_stencil8_cube",		GL_DEPTH24_STENCIL8));

		// OES_texture_stencil8
		formatGroup->addChild(new UploadTex2DCase		(m_context, "stencil_index8_2d",			GL_STENCIL_INDEX8));
		formatGroup->addChild(new UploadTex2DArrayCase	(m_context, "stencil_index8_2d_array",		GL_STENCIL_INDEX8));
		formatGroup->addChild(new UploadTexCubeCase		(m_context, "stencil_index8_cube",			GL_STENCIL_INDEX8));
	}

	// .render
	{
		tcu::TestCaseGroup* const readRenderGroup = new tcu::TestCaseGroup(m_testCtx, "render", "Read rendered stencil values");
		addChild(readRenderGroup);

		readRenderGroup->addChild(new ClearTex2DCase	(m_context, "depth32f_stencil8_clear",	GL_DEPTH32F_STENCIL8));
		readRenderGroup->addChild(new RenderTex2DCase	(m_context, "depth32f_stencil8_draw",	GL_DEPTH32F_STENCIL8));
		readRenderGroup->addChild(new ClearTex2DCase	(m_context, "depth24_stencil8_clear",	GL_DEPTH24_STENCIL8));
		readRenderGroup->addChild(new RenderTex2DCase	(m_context, "depth24_stencil8_draw",	GL_DEPTH24_STENCIL8));
	}

	// .misc
	{
		tcu::TestCaseGroup* const miscGroup = new tcu::TestCaseGroup(m_testCtx, "misc", "Misc cases");
		addChild(miscGroup);

		miscGroup->addChild(new CompareModeCase	(m_context, "compare_mode_effect",	GL_DEPTH24_STENCIL8));
		miscGroup->addChild(new BaseLevelCase	(m_context, "base_level",			GL_DEPTH24_STENCIL8));
	}
}